

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int jsonEachFilter(sqlite3_vtab_cursor *cur,int idxNum,char *idxStr,int argc,sqlite3_value **argv)

{
  ulong uVar1;
  long lVar2;
  int iVar3;
  u32 uVar4;
  sqlite3 *psVar5;
  uchar *puVar6;
  sqlite3_context *ctx;
  FuncDef *pFVar7;
  char *pcVar8;
  int in_ESI;
  sqlite3_value *in_RDI;
  long in_FS_OFFSET;
  char *unaff_retaddr;
  u32 n;
  u32 i;
  char *zRoot;
  JsonEachCursor *p;
  u32 sz;
  undefined4 in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffac;
  uint uVar9;
  undefined4 uVar10;
  u32 uVar11;
  JsonParse *pParse;
  sqlite3_value *pJson;
  int local_10;
  u32 local_c [2];
  
  unique0x00012000 = *(long *)(in_FS_OFFSET + 0x28);
  pParse = (JsonParse *)0x0;
  uVar10 = 0xaaaaaaaa;
  uVar9 = 0xaaaaaaaa;
  local_c[0] = 0xaaaaaaaa;
  pJson = in_RDI;
  jsonEachCursorReset((JsonEachCursor *)0x2a4622);
  if (in_ESI == 0) {
    local_10 = 0;
    goto LAB_002a4b43;
  }
  memset(&pJson[3].db,0,0x48);
  *(undefined4 *)((long)&pJson[4].u + 4) = 1;
  pJson[3].xDel = pJson->xDel;
  iVar3 = jsonFuncArgMightBeBinary(pJson);
  if (iVar3 == 0) {
    puVar6 = sqlite3_value_text((sqlite3_value *)0x2a46cc);
    pJson[3].zMalloc = (char *)puVar6;
    iVar3 = sqlite3_value_bytes((sqlite3_value *)0x2a46e8);
    pJson[4].u.nZero = iVar3;
    if (pJson[3].zMalloc == (char *)0x0) {
      pJson->n = 0;
      *(undefined4 *)((long)&pJson->z + 4) = 0;
      local_10 = 0;
      goto LAB_002a4b43;
    }
    iVar3 = jsonConvertTextToBlob(pParse,(sqlite3_context *)CONCAT44(uVar10,uVar9));
    if (iVar3 != 0) {
      if (*(char *)((long)&pJson[4].z + 7) == '\0') {
        sqlite3_free((void *)0x2a4afb);
        pFVar7 = (FuncDef *)sqlite3_mprintf("malformed JSON");
        ((in_RDI->u).pDef)->pNext = pFVar7;
        jsonEachCursorReset((JsonEachCursor *)0x2a4b22);
        local_10 = 7;
        if (((in_RDI->u).pDef)->pNext != (FuncDef *)0x0) {
          local_10 = 1;
        }
      }
      else {
        local_10 = 7;
      }
      goto LAB_002a4b43;
    }
  }
  else {
    iVar3 = sqlite3_value_bytes((sqlite3_value *)0x2a4691);
    pJson[3].szMalloc = iVar3;
    psVar5 = (sqlite3 *)sqlite3_value_blob((sqlite3_value *)pParse);
    pJson[3].db = psVar5;
  }
  if (in_ESI == 3) {
    ctx = (sqlite3_context *)sqlite3_value_text((sqlite3_value *)0x2a477e);
    if (ctx == (sqlite3_context *)0x0) {
      local_10 = 0;
      goto LAB_002a4b43;
    }
    if (*(uchar *)&ctx->pOut != '$') {
      sqlite3_free((void *)0x2a47b6);
      pFVar7 = (FuncDef *)jsonBadPathError(ctx,(char *)CONCAT44(uVar10,uVar9));
      ((in_RDI->u).pDef)->pNext = pFVar7;
      jsonEachCursorReset((JsonEachCursor *)0x2a47dd);
      local_10 = 7;
      if (((in_RDI->u).pDef)->pNext != (FuncDef *)0x0) {
        local_10 = 1;
      }
      goto LAB_002a4b43;
    }
    iVar3 = sqlite3Strlen30((char *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
    lVar2 = stack0xfffffffffffffff8;
    pJson->flags = (short)iVar3;
    pJson->enc = (char)((uint)iVar3 >> 0x10);
    pJson->eSubtype = (char)((uint)iVar3 >> 0x18);
    if (*(uchar *)((long)&ctx->pOut + 1) == '\0') {
      *(undefined4 *)((long)&pJson->z + 4) = 0;
      uVar11 = 0;
      *(undefined1 *)&pJson->db = 0;
    }
    else {
      uVar1 = (ulong)stack0xfffffffffffffff8 >> 0x20;
      uVar11 = (u32)uVar1;
      unique0x10000754 = lVar2;
      uVar11 = jsonLookupStep((JsonParse *)zRoot,i,unaff_retaddr,uVar11);
      if (0xfffffffc < uVar11) {
        if (uVar11 == 0xfffffffe) {
          *(undefined4 *)((long)&pJson->z + 4) = 0;
          *(undefined1 *)&pJson->db = 0;
          pJson->n = 0;
          local_10 = 0;
        }
        else {
          sqlite3_free((void *)0x2a48ba);
          pFVar7 = (FuncDef *)jsonBadPathError(ctx,(char *)CONCAT44(uVar11,uVar9));
          ((in_RDI->u).pDef)->pNext = pFVar7;
          jsonEachCursorReset((JsonEachCursor *)0x2a48e1);
          local_10 = 7;
          if (((in_RDI->u).pDef)->pNext != (FuncDef *)0x0) {
            local_10 = 1;
          }
        }
        goto LAB_002a4b43;
      }
      if (*(int *)((long)&pJson[4].db + 4) == 0) {
        *(u32 *)((long)&pJson->z + 4) = uVar11;
        *(undefined1 *)&pJson->db = 0xb;
      }
      else {
        *(undefined4 *)((long)&pJson->z + 4) = *(undefined4 *)((long)&pJson[4].db + 4);
        *(undefined1 *)&pJson->db = 0xc;
      }
    }
    jsonAppendRaw((JsonString *)CONCAT44(uVar11,uVar9),
                  (char *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),0);
  }
  else {
    *(undefined4 *)((long)&pJson->z + 4) = 0;
    uVar11 = 0;
    *(undefined1 *)&pJson->db = 0;
    pJson->flags = 1;
    pJson->enc = '\0';
    pJson->eSubtype = '\0';
    jsonAppendRaw((JsonString *)(ulong)uVar9,
                  (char *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),0);
  }
  *(undefined4 *)((long)&pJson->db + 4) = 0;
  uVar4 = jsonbPayloadSize((JsonParse *)&pJson[3].db,uVar11,local_c);
  pJson->n = uVar11 + uVar4 + local_c[0];
  if ((10 < (*(byte *)((long)&(pJson[3].db)->pVfs + (ulong)uVar11) & 0xf)) &&
     (*(char *)((long)&pJson->db + 1) == '\0')) {
    *(u32 *)((long)&pJson->z + 4) = uVar11 + uVar4;
    *(byte *)&pJson->db = *(byte *)((long)&(pJson[3].db)->pVfs + (ulong)uVar11) & 0xf;
    pcVar8 = (char *)sqlite3DbMallocZero((sqlite3 *)CONCAT44(uVar11,uVar4),
                                         CONCAT44(in_stack_ffffffffffffffac,
                                                  in_stack_ffffffffffffffa8));
    pJson->zMalloc = pcVar8;
    if (pJson->zMalloc == (char *)0x0) {
      local_10 = 7;
      goto LAB_002a4b43;
    }
    *(undefined4 *)((long)&pJson->db + 4) = 1;
    pJson->szMalloc = 1;
    pcVar8 = pJson->zMalloc;
    pcVar8[0x10] = '\0';
    pcVar8[0x11] = '\0';
    pcVar8[0x12] = '\0';
    pcVar8[0x13] = '\0';
    pcVar8[0x14] = '\0';
    pcVar8[0x15] = '\0';
    pcVar8[0x16] = '\0';
    pcVar8[0x17] = '\0';
    *(int *)(pJson->zMalloc + 8) = pJson->n;
    *(undefined4 *)pJson->zMalloc = *(undefined4 *)((long)&pJson->z + 4);
    *(u32 *)(pJson->zMalloc + 4) = uVar11;
  }
  local_10 = 0;
LAB_002a4b43:
  if (*(long *)(in_FS_OFFSET + 0x28) != stack0xfffffffffffffff8) {
    __stack_chk_fail();
  }
  return local_10;
}

Assistant:

static int jsonEachFilter(
  sqlite3_vtab_cursor *cur,
  int idxNum, const char *idxStr,
  int argc, sqlite3_value **argv
){
  JsonEachCursor *p = (JsonEachCursor*)cur;
  const char *zRoot = 0;
  u32 i, n, sz;

  UNUSED_PARAMETER(idxStr);
  UNUSED_PARAMETER(argc);
  jsonEachCursorReset(p);
  if( idxNum==0 ) return SQLITE_OK;
  memset(&p->sParse, 0, sizeof(p->sParse));
  p->sParse.nJPRef = 1;
  p->sParse.db = p->db;
  if( jsonFuncArgMightBeBinary(argv[0]) ){
    p->sParse.nBlob = sqlite3_value_bytes(argv[0]);
    p->sParse.aBlob = (u8*)sqlite3_value_blob(argv[0]);
  }else{
    p->sParse.zJson = (char*)sqlite3_value_text(argv[0]);
    p->sParse.nJson = sqlite3_value_bytes(argv[0]);
    if( p->sParse.zJson==0 ){
      p->i = p->iEnd = 0;
      return SQLITE_OK;
    }
    if( jsonConvertTextToBlob(&p->sParse, 0) ){
      if( p->sParse.oom ){
        return SQLITE_NOMEM;
      }
      goto json_each_malformed_input;
    }
  }
  if( idxNum==3 ){
    zRoot = (const char*)sqlite3_value_text(argv[1]);
    if( zRoot==0 ) return SQLITE_OK;
    if( zRoot[0]!='$' ){
      sqlite3_free(cur->pVtab->zErrMsg);
      cur->pVtab->zErrMsg = jsonBadPathError(0, zRoot);
      jsonEachCursorReset(p);
      return cur->pVtab->zErrMsg ? SQLITE_ERROR : SQLITE_NOMEM;
    }
    p->nRoot = sqlite3Strlen30(zRoot);
    if( zRoot[1]==0 ){
      i = p->i = 0;
      p->eType = 0;
    }else{
      i = jsonLookupStep(&p->sParse, 0, zRoot+1, 0);
      if( JSON_LOOKUP_ISERROR(i) ){
        if( i==JSON_LOOKUP_NOTFOUND ){
          p->i = 0;
          p->eType = 0;
          p->iEnd = 0;
          return SQLITE_OK;
        }
        sqlite3_free(cur->pVtab->zErrMsg);
        cur->pVtab->zErrMsg = jsonBadPathError(0, zRoot);
        jsonEachCursorReset(p);
        return cur->pVtab->zErrMsg ? SQLITE_ERROR : SQLITE_NOMEM;
      }
      if( p->sParse.iLabel ){
        p->i = p->sParse.iLabel;
        p->eType = JSONB_OBJECT;
      }else{
        p->i = i;
        p->eType = JSONB_ARRAY;
      }
    }
    jsonAppendRaw(&p->path, zRoot, p->nRoot);
  }else{
    i = p->i = 0;
    p->eType = 0;
    p->nRoot = 1;
    jsonAppendRaw(&p->path, "$", 1);
  }
  p->nParent = 0;
  n = jsonbPayloadSize(&p->sParse, i, &sz);
  p->iEnd = i+n+sz;
  if( (p->sParse.aBlob[i] & 0x0f)>=JSONB_ARRAY && !p->bRecursive ){
    p->i = i + n;
    p->eType = p->sParse.aBlob[i] & 0x0f;
    p->aParent = sqlite3DbMallocZero(p->db, sizeof(JsonParent));
    if( p->aParent==0 ) return SQLITE_NOMEM;
    p->nParent = 1;
    p->nParentAlloc = 1;
    p->aParent[0].iKey = 0;
    p->aParent[0].iEnd = p->iEnd;
    p->aParent[0].iHead = p->i;
    p->aParent[0].iValue = i;
  }
  return SQLITE_OK;

json_each_malformed_input:
  sqlite3_free(cur->pVtab->zErrMsg);
  cur->pVtab->zErrMsg = sqlite3_mprintf("malformed JSON");
  jsonEachCursorReset(p);
  return cur->pVtab->zErrMsg ? SQLITE_ERROR : SQLITE_NOMEM;
}